

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraALU_cpp.h
# Opt level: O0

u32 __thiscall moira::Moira::logic<(moira::Core)0,(moira::Instr)87,1>(Moira *this,u32 op)

{
  bool bVar1;
  uint uVar2;
  u32 result;
  u32 op_local;
  Moira *this_local;
  
  uVar2 = op ^ 0xffffffff;
  bVar1 = NBIT<1>((ulong)uVar2);
  (this->reg).sr.n = bVar1;
  bVar1 = ZERO<1>((ulong)uVar2);
  (this->reg).sr.z = bVar1;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  return uVar2;
}

Assistant:

u32
Moira::logic(u32 op)
{
    u32 result;

    switch (I) {

        case Instr::NOT:
        case Instr::NOT_LOOP:

            result = ~op;
            reg.sr.n = NBIT<S>(result);
            reg.sr.z = ZERO<S>(result);
            reg.sr.v = 0;
            reg.sr.c = 0;
            break;

        case Instr::NEG:
        case Instr::NEG_LOOP:

            result = addsub<C, Instr::SUB, S>(op, 0);
            break;

        case Instr::NEGX:
        case Instr::NEGX_LOOP:

            result = addsub<C, Instr::SUBX, S>(op, 0);
            break;

        default:
            fatalError;
    }
    return result;
}